

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas-calc.c
# Opt level: O3

_Bool adjust_order_ops_depth_block(borg_calculation *f,int pdepth,int start,int end)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  void **ppvVar7;
  borg_array *pbVar8;
  void **ppvVar9;
  undefined1 extraout_AL;
  borg_array *a;
  uint *item;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  int l [4];
  int local_48 [6];
  
  a = (borg_array *)mem_zalloc(0x10);
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  if (start < end) {
    lVar15 = (long)start;
    do {
      puVar6 = (uint *)f->token_array->items[lVar15];
      if ((puVar6[4] == pdepth) && (2 < *puVar6)) {
        item = (uint *)mem_alloc(0xc);
        uVar2 = *puVar6;
        *item = uVar2;
        uVar10 = 0;
        if ((1 < uVar2 - 5) && (uVar10 = 1, 1 < uVar2 - 3)) {
          uVar10 = (uVar2 - 7 < 2) + 2;
        }
        item[1] = uVar10;
        item[2] = (uint)lVar15;
        local_48[uVar10] = local_48[uVar10] + 1;
        borg_array_add(a,item);
      }
      lVar15 = lVar15 + 1;
    } while (end != (int)lVar15);
  }
  iVar3 = a->count;
  if (1 < (long)iVar3) {
    uVar11 = 0;
    lVar15 = 1;
    iVar12 = 0;
    do {
      if (local_48[uVar11] != 0) {
        ppvVar7 = a->items;
        lVar13 = 0;
        do {
          lVar14 = lVar15;
          if (uVar11 == *(uint *)((long)ppvVar7[lVar13] + 4)) {
            do {
              if (lVar14 == 4) {
                if (iVar3 + -1 <= iVar12) goto LAB_00224092;
                break;
              }
              piVar1 = local_48 + lVar14;
              lVar14 = lVar14 + 1;
            } while (*piVar1 == 0);
            uVar2 = *(uint *)((long)ppvVar7[lVar13] + 8);
            lVar14 = (long)(int)uVar2;
            pbVar8 = f->token_array;
            ppvVar9 = pbVar8->items;
            uVar10 = *(uint *)((long)ppvVar9[lVar14] + 0x10);
            *(uint *)((long)ppvVar9[lVar14] + 0x10) = uVar10 + 1;
            if (0 < lVar14) {
              uVar17 = lVar14 + 1;
              do {
                puVar6 = (uint *)ppvVar9[uVar17 - 2];
                uVar4 = puVar6[4];
                if (((int)uVar4 < (int)uVar10) || ((2 < *puVar6 && (uVar4 == uVar10)))) break;
                puVar6[4] = uVar4 + 1;
                if (f->max_depth <= (int)uVar4) {
                  f->max_depth = uVar4 + 1;
                }
                uVar17 = uVar17 - 1;
              } while (1 < uVar17);
            }
            iVar5 = pbVar8->count;
            if ((int)(lVar14 + 1) < iVar5) {
              lVar16 = 0;
              do {
                puVar6 = (uint *)ppvVar9[lVar14 + 1 + lVar16];
                uVar4 = puVar6[4];
                if (((int)uVar4 < (int)uVar10) || ((2 < *puVar6 && (uVar4 == uVar10)))) break;
                puVar6[4] = uVar4 + 1;
                if (f->max_depth <= (int)uVar4) {
                  f->max_depth = uVar4 + 1;
                }
                lVar16 = lVar16 + 1;
              } while (~uVar2 + iVar5 != (int)lVar16);
            }
            iVar12 = iVar12 + 1;
          }
LAB_00224092:
          lVar13 = lVar13 + 1;
        } while (lVar13 != iVar3);
      }
      uVar11 = uVar11 + 1;
      lVar15 = lVar15 + 1;
    } while (uVar11 != 4);
  }
  if (0 < iVar3) {
    lVar15 = 0;
    do {
      mem_free(a->items[lVar15]);
      a->items[lVar15] = (void *)0x0;
      lVar15 = lVar15 + 1;
    } while (lVar15 < a->count);
  }
  mem_free(a);
  return (_Bool)extraout_AL;
}

Assistant:

static bool adjust_order_ops_depth_block(
    struct borg_calculation *f, int pdepth, int start, int end)
{
    struct operator_struct {
        enum token_type type;
        int             level;
        int             position;
    };
    struct borg_array      *operators = mem_zalloc(sizeof(struct borg_array));
    struct operator_struct *o;
    int                     tok;
    int                     i, j;
    int                     lvl;
    int                     l[4] = { 0, 0, 0, 0 };

    for (tok = start; tok < end; tok++) {
        struct token *token = f->token_array->items[tok];
        if (token->pdepth != pdepth)
            continue;
        if (is_operator(token->type)) {
            o           = mem_alloc(sizeof(struct operator_struct));
            o->type     = token->type;
            o->level    = operation_level(token->type);
            o->position = tok;
            l[o->level]++;
            borg_array_add(operators, o);
        }
    }

    /* find groups at the same level so the formula */
    /* 1 + 2 * (3 + 4 * 5) + 6 + 7 */
    /* already has things at two levels */
    /* "1 + 2 *" is at one level "3 + 4 * 5" is deeper (done first) and */
    /* "+ 6 + 7" is back at the first level.  */
    /* it grabs the groups and the adds depth (as if they were parenthesized) */
    /* to higher operations levels.  so it grabs 1 + 2 * (deeper) and */
    /* calculates "*" is first so it makes it as if it was 1 + (2 * (deeper)) */
    /* by pushing the 2 and the "(deeper)" down.  Repeat until all levels are */
    /* handled */
    bool higher;
    if (operators->count > 1) {
        int count_at_level = 0;
        for (lvl = 0; lvl < OP_LEVELS; lvl++) {
            if (l[lvl]) {
                for (i = 0; i < operators->count; i++) {
                    o = operators->items[i];
                    if (o->level == lvl) {
                        /* if there is an at higher level or this isn't the last
                         */
                        /* the last check is for a*b*c needs to be (a*b)*c */
                        higher = false;
                        for (j = lvl + 1; j < OP_LEVELS; j++)
                            if (l[j]) {
                                higher = true;
                                break;
                            }
                        if (higher || count_at_level < (operators->count - 1)) {
                            add_depth(f, o->position);
                            count_at_level++;
                        }
                    }
                }
            }
        }
    }

    /* free up the temporary memory */
    for (i = 0; i < operators->count; i++) {
        mem_free(operators->items[i]);
        operators->items[i] = NULL;
    }
    mem_free(operators);
    operators = NULL;

    return false;
}